

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::tag<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  size_t sVar1;
  bool bVar2;
  TypeUse *pTVar3;
  ImportNames *pIVar4;
  ImportNames *pIVar5;
  string_view expected;
  Name NVar6;
  string local_148;
  TypeUse local_128;
  undefined1 local_108 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  undefined1 local_c0 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  size_t local_90;
  undefined1 local_88 [8];
  Result<wasm::WATParser::TypeUse> type;
  Result<wasm::WATParser::TypeUse> _val_2;
  
  this = &ctx->in;
  sVar1 = (ctx->in).pos;
  expected._M_str = "tag";
  expected._M_len = 3;
  bVar2 = Lexer::takeSExprStart(this,expected);
  if (bVar2) {
    Lexer::takeID((optional<wasm::Name> *)local_108,this);
    if (exports.val.
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[8] == '\0') {
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_index =
           '\0';
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._33_7_ = 0;
      local_90 = 0;
    }
    else {
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
           exports.val.
           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
           super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
           super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
      local_90 = (size_t)local_108;
    }
    inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_108,this);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_c0,
                    (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_108);
    if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
        _24_1_ == '\x01') {
      std::__cxx11::string::string((string *)local_88,(string *)local_c0);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                         *)local_c0);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                         *)local_c0);
      inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_c0,this);
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
                 local_88,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_c0);
      if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x02') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   (string *)local_88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_88);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           *)local_88);
        typeuse<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::TypeUse> *)local_88,ctx,true);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)local_88);
        if (_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                     (string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&exports.val.
                              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                              .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                            ((long)&type.val.
                                    super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                            0x20));
        }
        else {
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                            ((long)&type.val.
                                    super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                            0x20));
          bVar2 = Lexer::takeRParen(this);
          if (bVar2) {
            pTVar3 = (TypeUse *)0x0;
            if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\0') {
              pTVar3 = (TypeUse *)local_88;
            }
            TypeUse::TypeUse(&local_128,pTVar3);
            pIVar4 = (ImportNames *)local_c0;
            if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                _M_u._24_1_ != '\0') {
              pIVar4 = (ImportNames *)0x0;
            }
            pIVar5 = (ImportNames *)local_108;
            if (exports.val.
                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0'
               ) {
              pIVar5 = (ImportNames *)0x0;
            }
            NVar6.super_IString.str._M_str =
                 (char *)import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         ._32_8_;
            NVar6.super_IString.str._M_len = local_90;
            ParseModuleTypesCtx::addTag
                      ((Result<wasm::Ok> *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       ctx,NVar6,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)pIVar5,pIVar4,
                       &local_128,(Index)sVar1);
            std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
                      (&local_128.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)
            ;
            if (_val_2.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\x01') {
              std::__cxx11::string::string
                        ((string *)
                         ((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                         (string *)
                         ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20)
                        );
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,
                         (__index_type *)
                         ((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20))
              ;
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&exports.val.
                                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20))
              ;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                + 0x20));
            }
            else {
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                + 0x20));
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"expected end of tag",
                       (allocator<char> *)
                       ((long)&exports.val.
                               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
            Lexer::err((Err *)((long)&type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20),this,&local_148);
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,
                       (__index_type *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
            std::__cxx11::string::~string((string *)&local_148);
          }
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)local_88);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         *)local_c0);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_108);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> tag(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("tag"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = typeuse(ctx);
  CHECK_ERR(type);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of tag");
  }

  CHECK_ERR(ctx.addTag(name, *exports, import.getPtr(), *type, pos));
  return Ok{};
}